

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *
bijectiveParameterization
          (vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
           *__return_storage_ptr__,Mesh *mesh,double error)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  pointer pVVar4;
  undefined1 (*pauVar5) [16];
  int i;
  long lVar6;
  double *pdVar7;
  long lVar8;
  VectorXd x;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> init_param;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  DenseStorage<double,__1,__1,_1,_0> local_68;
  _Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> local_58;
  double *local_38;
  Index IStack_30;
  undefined8 local_28;
  
  init((EVP_PKEY_CTX *)&local_58);
  pVVar4 = local_58._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start;
  local_38 = (double *)(lVar8 >> 2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_78,(unsigned_long *)&stack0xffffffffffffffc8)
  ;
  pauVar5 = (undefined1 (*) [16])local_78.m_data;
  for (lVar6 = 0; lVar8 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    uVar1 = *(undefined8 *)pVVar4[lVar6].values_._M_elems;
    dVar3 = (double)(float)((ulong)uVar1 >> 0x20);
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = (double)(float)uVar1;
    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
    *pauVar5 = auVar2;
    pauVar5 = pauVar5 + 1;
  }
  getAveLen(mesh,(VectorXd *)&local_78);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_68,&local_78);
  local_28 = 0x3f40624dd2f1a9fc;
  LBFGS((Mesh *)&stack0xffffffffffffffc8,(VectorXd *)mesh,(double *)&local_68);
  pdVar7 = local_78.m_data;
  local_78.m_data = local_38;
  local_78.m_rows = IStack_30;
  free(pdVar7);
  free(local_68.m_data);
  pdVar7 = local_78.m_data;
  for (lVar6 = 0;
      (long)local_58._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
    *(ulong *)local_58._M_impl.super__Vector_impl_data._M_start[lVar6].values_._M_elems =
         CONCAT44((float)pdVar7[1],(float)*pdVar7);
    pdVar7 = pdVar7 + 2;
  }
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_58._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = local_58._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  free(local_78.m_data);
  std::_Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
  ~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<OpenMesh::Vec2f> bijectiveParameterization(Mesh& mesh, double error) {
    auto init_param = init(mesh); // the initial parameterization for the mesh
    Eigen::VectorXd x(init_param.size() * 2);
    for (int i = 0; i < init_param.size(); ++i) {
        x[2 * i] = init_param[i][0];
        x[2 * i + 1] = init_param[i][1];
    }

    auto epsilon = getAveLen(mesh, x) * 0.25;
    // std::cerr << checkCreterion(mesh, x, epsilon) << std::endl;
    x = LBFGS(mesh, x, 0.0005); // optimize the parameterization using Quasi Newton Method

    // copy the result into a vector
    for (int i = 0; i < init_param.size(); ++i) {
        init_param[i][0] = x[2 * i];
        init_param[i][1] = x[2 * i + 1];
    }

    return std::move(init_param);
}